

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

void __thiscall
QDirListing::QDirListing
          (QDirListing *this,QString *path,QStringList *nameFilters,uint qdirFilters,
          uint qdirIteratorFlags)

{
  uint uVar1;
  QDirListingPrivate *pQVar2;
  long in_FS_OFFSET;
  QFileSystemEntry local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QDirListingPrivate *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(pQVar2);
  this->d = pQVar2;
  QFileSystemEntry::QFileSystemEntry(&local_70,path);
  QFileSystemEntry::operator=(&(this->d->initialEntryInfo).entry,&local_70);
  QFileSystemEntry::~QFileSystemEntry(&local_70);
  QArrayDataPointer<QString>::operator=(&(this->d->nameFilters).d,&nameFilters->d);
  pQVar2 = this->d;
  pQVar2->useLegacyFilters = true;
  (pQVar2->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
  super_QFlagsStorage<QDir::Filter>.i = qdirFilters;
  uVar1 = (uint)(ushort)(((ushort)qdirIteratorFlags & 3) << 8) * 0x40;
  (pQVar2->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i =
       (uVar1 >> 1 & 0x5550) + (uVar1 & 0x5550) * 2 >> 4;
  QDirListingPrivate::init(this->d,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, const QStringList &nameFilters, uint qdirFilters,
                         uint qdirIteratorFlags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->nameFilters = nameFilters;
    d->setLegacyFilters(QDir::Filters::fromInt(qdirFilters),
                        QDirIterator::IteratorFlags::fromInt(qdirIteratorFlags));
    d->init();
}